

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O3

uint8_t sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(uint8_t opcode)

{
  undefined3 in_register_00000039;
  uint uVar1;
  
  uVar1 = CONCAT31(in_register_00000039,opcode);
  if (((0x26 < uVar1) || ((0x6000020000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) && (uVar1 != 0xe0)) {
    return '\0';
  }
  return '\x01';
}

Assistant:

SYSBVM_API uint8_t sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(uint8_t opcode)
{
    switch(opcode)
    {
    case SYSBVM_OPCODE_JUMP:
    case SYSBVM_OPCODE_JUMP_IF_TRUE:
    case SYSBVM_OPCODE_JUMP_IF_FALSE:
    case SYSBVM_OPCODE_CASE_JUMP:
        return 1;
    default: return 0;
    }
}